

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

void __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::LogCommitPages(PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 *this,size_t pageCount)

{
  PageMemoryData *pPVar1;
  ulong uVar2;
  
  this->committedBytes = this->committedBytes + pageCount * 0x1000;
  pPVar1 = this->memoryData;
  if (pPVar1 != (PageMemoryData *)0x0) {
    uVar2 = pageCount + pPVar1->currentCommittedPageCount;
    pPVar1->currentCommittedPageCount = uVar2;
    if (uVar2 < pPVar1->peakCommittedPageCount) {
      uVar2 = pPVar1->peakCommittedPageCount;
    }
    pPVar1->peakCommittedPageCount = uVar2;
  }
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::LogCommitPages(size_t pageCount)
{
    AddCommittedBytes(pageCount * AutoSystemInfo::PageSize);
#ifdef PROFILE_MEM
    if (this->memoryData)
    {
        this->memoryData->currentCommittedPageCount += pageCount;
        this->memoryData->peakCommittedPageCount = max(this->memoryData->peakCommittedPageCount, this->memoryData->currentCommittedPageCount);
    }
#endif
}